

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Node * __thiscall rw::ColorQuant::getNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  LLLink *pLVar1;
  Node *pNVar2;
  uint uVar3;
  Node *pNVar4;
  
  if (level != 0) {
    pNVar4 = root;
    do {
      uVar3 = addr & 0xf;
      root = pNVar4->children[uVar3];
      if (root == (Node *)0x0) {
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
        ;
        pNVar2 = (Node *)(*DAT_00149de8)(0xb0);
        pNVar2->r = 0;
        pNVar2->g = 0;
        pNVar2->b = 0;
        pNVar2->a = 0;
        pNVar2->numPixels = 0;
        memset(&pNVar2->parent,0,0x98);
        if (level == 1) {
          (pNVar2->link).next = &(this->leaves).link;
          pLVar1 = (this->leaves).link.prev;
          (pNVar2->link).prev = pLVar1;
          pLVar1->next = &pNVar2->link;
          (this->leaves).link.prev = &pNVar2->link;
        }
        pNVar4->children[uVar3] = pNVar2;
        pNVar2->parent = pNVar4;
        root = pNVar4->children[uVar3];
      }
      addr = addr >> 4;
      level = level + -1;
      pNVar4 = root;
    } while (level != 0);
  }
  return root;
}

Assistant:

ColorQuant::Node*
ColorQuant::getNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil){
		root->children[a] = this->createNode(level-1);
		root->children[a]->parent = root;
	}

	return this->getNode(root->children[a], addr>>4, level-1);
}